

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate1.hpp
# Opt level: O3

void __thiscall
qclab::qgates::RotationY<double>::RotationY
          (RotationY<double> *this,int qubit,rotation_type *rot,bool fixed)

{
  double dVar1;
  
  (this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>._vptr_QObject =
       (_func_int **)&PTR_nbQubits_0013a0a0;
  (this->super_QRotationGate1<double>).super_QGate1<double>.qubit_ = qubit;
  if (-1 < qubit) {
    (this->super_QRotationGate1<double>).super_QGate1<double>.field_0xc = fixed;
    (this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_0013a770;
    dVar1 = (rot->angle_).sin_;
    (this->super_QRotationGate1<double>).rotation_.angle_.cos_ = (rot->angle_).cos_;
    (this->super_QRotationGate1<double>).rotation_.angle_.sin_ = dVar1;
    (this->super_QRotationGate1<double>).super_QGate1<double>.super_QObject<double>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_0013a610;
    return;
  }
  __assert_fail("qubit >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/QGate1.hpp"
                ,0x21,"qclab::qgates::QGate1<double>::QGate1(const int) [T = double]");
}

Assistant:

QGate1( const int qubit )
        : qubit_( qubit )
        {
          assert( qubit >= 0 ) ;
        }